

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O1

void ImGui::TableEndRow(ImGuiTable *table)

{
  ImGuiTableCellData *pIVar1;
  ImVec4 *pIVar2;
  ImVec2 IVar3;
  char cVar4;
  ImGuiWindow *pIVar5;
  ImDrawList *pIVar6;
  ImGuiTableColumn *pIVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  ulong uVar33;
  ImVec2 IVar34;
  ImVec2 IVar35;
  bool bVar36;
  ImGuiContext *pIVar37;
  ImS8 *pIVar38;
  long lVar39;
  int iVar40;
  long lVar41;
  int iVar42;
  ImGuiTableCellData *pIVar43;
  int iVar44;
  ImU32 col;
  ImU32 col_00;
  uint uVar45;
  uint uVar46;
  float fVar47;
  long lVar48;
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  int iVar59;
  int iVar61;
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  long lVar60;
  float fVar62;
  float fVar63;
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  float fVar68;
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 in_XMM11 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  int iVar86;
  undefined1 auVar84 [16];
  int iVar87;
  undefined1 auVar85 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  int iVar101;
  int iVar105;
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  ImRect row_rect;
  ImU32 local_7c;
  ImVec2 local_78;
  ImVec2 IStack_70;
  undefined1 local_68 [16];
  int local_54;
  int local_50;
  int local_4c;
  float local_48;
  undefined4 uStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  ImVec2 local_38;
  long lVar67;
  
  pIVar37 = GImGui;
  pIVar5 = GImGui->CurrentWindow;
  if (table->CurrentColumn != -1) {
    TableEndCell(table);
  }
  if (pIVar37->LogEnabled == true) {
    LogRenderedText((ImVec2 *)0x0,"|",(char *)0x0);
  }
  local_48 = table->RowPosY2;
  (pIVar5->DC).CursorPos.y = local_48;
  fVar47 = table->RowPosY1;
  local_68 = ZEXT416((uint)fVar47);
  uStack_44 = 0;
  uStack_40 = 0;
  uStack_3c = 0;
  if (table->CurrentRow == 0) {
    table->LastFirstRowHeight = local_48 - fVar47;
  }
  iVar40 = table->CurrentRow + 1;
  iVar42 = (int)table->FreezeRowsCount;
  iVar44 = (int)table->FreezeRowsRequest;
  if (((table->InnerClipRect).Min.y <= local_48) && (fVar47 <= (table->InnerClipRect).Max.y)) {
    col_00 = table->RowBgColor[0];
    local_54 = iVar44;
    if ((col_00 == 0x1000000) && (col_00 = 0, (table->Flags & 0x40) != 0)) {
      col_00 = GetColorU32((table->RowBgColorCounter & 1U) + 0x2d,1.0);
    }
    local_7c = 0;
    col = table->RowBgColor[1];
    if (table->RowBgColor[1] == 0x1000000) {
      col = 0;
    }
    if (((0 < table->CurrentRow) || (table->InnerWindow == table->OuterWindow)) &&
       ((table->Flags & 0x80) != 0)) {
      local_7c = table->RowBgColor[(ulong)((table->field_0x92 & 1) == 0) + 2];
    }
    cVar4 = table->RowCellDataCurrent;
    local_50 = iVar42;
    local_4c = iVar40;
    if ((-1 < cVar4 || iVar40 == iVar42) || (local_7c != 0 || (col != 0 || col_00 != 0))) {
      if ((table->Flags & 0x100000) == 0) {
        fVar47 = (table->Bg0ClipRectForDrawCmd).Min.y;
        fVar62 = (table->Bg0ClipRectForDrawCmd).Max.x;
        fVar68 = (table->Bg0ClipRectForDrawCmd).Max.y;
        pIVar6 = pIVar5->DrawList;
        (pIVar6->_CmdHeader).ClipRect.x = (table->Bg0ClipRectForDrawCmd).Min.x;
        (pIVar6->_CmdHeader).ClipRect.y = fVar47;
        (pIVar6->_CmdHeader).ClipRect.z = fVar62;
        (pIVar6->_CmdHeader).ClipRect.w = fVar68;
      }
      ImDrawListSplitter::SetCurrentChannel(&table->DrawSplitter,pIVar5->DrawList,0);
    }
    if (col != 0 || col_00 != 0) {
      fVar47 = (table->WorkRect).Min.x;
      fVar62 = (table->WorkRect).Max.x;
      IVar3 = (table->BgClipRect).Min;
      fVar68 = IVar3.x;
      fVar63 = IVar3.y;
      uVar45 = -(uint)(fVar68 <= fVar47);
      uVar46 = -(uint)(fVar63 <= (float)local_68._0_4_);
      local_78 = (ImVec2)(CONCAT44(~uVar46 & (uint)fVar63,~uVar45 & (uint)fVar68) |
                         CONCAT44(local_68._0_4_ & uVar46,(uint)fVar47 & uVar45));
      auVar64._8_8_ = 0;
      auVar64._0_4_ = (table->BgClipRect).Max.x;
      auVar64._4_4_ = (table->BgClipRect).Max.y;
      auVar84._4_8_ = 0;
      auVar84._0_4_ = fVar62;
      auVar84._12_4_ = uStack_44;
      auVar49._8_8_ = auVar84._8_8_;
      auVar49._4_4_ = local_48;
      auVar49._0_4_ = fVar62;
      auVar64 = minps(auVar49,auVar64);
      IStack_70 = auVar64._0_8_;
      if ((col_00 != 0) && (IStack_70.y = auVar64._4_4_, bVar36 = local_78.y < IStack_70.y, bVar36))
      {
        ImDrawList::AddRectFilled(pIVar5->DrawList,&local_78,&IStack_70,col_00,0.0,0xf);
      }
      if ((col != 0) && (local_78.y < IStack_70.y)) {
        ImDrawList::AddRectFilled(pIVar5->DrawList,&local_78,&IStack_70,col,0.0,0xf);
      }
    }
    if ((-1 < cVar4) && (-1 < (long)table->RowCellDataCurrent)) {
      pIVar43 = (table->RowCellData).Data;
      pIVar1 = pIVar43 + table->RowCellDataCurrent;
      do {
        pIVar7 = (table->Columns).Data;
        cVar4 = pIVar43->Column;
        fVar47 = pIVar7[cVar4].MinX;
        if (pIVar7[cVar4].PrevEnabledColumn == -1) {
          fVar47 = fVar47 - table->CellSpacingX1;
        }
        fVar62 = pIVar7[cVar4].MaxX;
        if (pIVar7[cVar4].NextEnabledColumn == -1) {
          fVar62 = fVar62 + table->CellSpacingX2;
        }
        auVar65._4_4_ = table->RowPosY2;
        auVar65._0_4_ = fVar62;
        auVar65._8_8_ = 0;
        IVar3 = (table->BgClipRect).Min;
        fVar62 = IVar3.x;
        fVar68 = IVar3.y;
        uVar45 = -(uint)(fVar62 <= fVar47);
        uVar46 = -(uint)(fVar68 <= table->RowPosY1);
        uVar33 = CONCAT44(~uVar46 & (uint)fVar68,~uVar45 & (uint)fVar62) |
                 CONCAT44((uint)table->RowPosY1 & uVar46,(uint)fVar47 & uVar45);
        auVar88._8_8_ = 0;
        auVar88._0_4_ = (table->BgClipRect).Max.x;
        auVar88._4_4_ = (table->BgClipRect).Max.y;
        auVar64 = minps(auVar65,auVar88);
        local_78.x = (float)uVar33;
        fVar47 = pIVar7[pIVar43->Column].ClipRect.Min.x;
        uVar45 = -(uint)(fVar47 <= local_78.x);
        local_78.y = (float)(uVar33 >> 0x20);
        local_78.x = (float)(~uVar45 & (uint)fVar47 | (uint)local_78.x & uVar45);
        IStack_70.x = auVar64._0_4_;
        if (pIVar7[pIVar43->Column].MaxX <= IStack_70.x) {
          IStack_70.x = pIVar7[pIVar43->Column].MaxX;
        }
        IStack_70.y = auVar64._4_4_;
        ImDrawList::AddRectFilled(pIVar5->DrawList,&local_78,&IStack_70,pIVar43->BgColor,0.0,0xf);
        pIVar43 = pIVar43 + 1;
      } while (pIVar43 <= pIVar1);
    }
    if (((local_7c != 0) && ((table->BgClipRect).Min.y <= (float)local_68._0_4_)) &&
       ((float)local_68._0_4_ < (table->BgClipRect).Max.y)) {
      local_78.y = (float)local_68._0_4_;
      local_78.x = table->BorderX1;
      local_38.x = table->BorderX2;
      local_38.y = (float)local_68._0_4_;
      ImDrawList::AddLine(pIVar5->DrawList,&local_78,&local_38,local_7c,1.0);
    }
    iVar40 = local_4c;
    iVar42 = local_50;
    iVar44 = local_54;
    if (((local_4c == local_50) && ((table->BgClipRect).Min.y <= local_48)) &&
       (local_48 < (table->BgClipRect).Max.y)) {
      local_78.y = local_48;
      local_78.x = table->BorderX1;
      local_38.x = table->BorderX2;
      local_38.y = local_48;
      ImDrawList::AddLine(pIVar5->DrawList,&local_78,&local_38,table->BorderColorStrong,1.0);
    }
  }
  auVar64 = _DAT_00166f00;
  if (iVar40 == iVar44) {
    iVar44 = table->ColumnsCount;
    if (0 < (long)iVar44) {
      lVar39 = (long)table->FreezeColumnsCount;
      lVar41 = (long)iVar44 + -1;
      local_68._8_4_ = (int)lVar41;
      local_68._0_8_ = lVar41;
      local_68._12_4_ = (int)((ulong)lVar41 >> 0x20);
      pIVar38 = &((table->Columns).Data)->NavLayerCurrent;
      lVar41 = 0xf;
      auVar49 = local_68;
      auVar66 = _DAT_00170610;
      auVar69 = _DAT_00170620;
      auVar70 = _DAT_00170630;
      auVar71 = _DAT_00170640;
      auVar72 = _DAT_00170650;
      auVar73 = _DAT_00170660;
      auVar74 = _DAT_00166ee0;
      auVar75 = _DAT_00166ef0;
      do {
        auVar84 = local_68 ^ auVar64;
        auVar88 = auVar75 ^ auVar64;
        iVar59 = auVar84._0_4_;
        iVar101 = -(uint)(iVar59 < auVar88._0_4_);
        iVar61 = auVar84._4_4_;
        auVar90._4_4_ = -(uint)(iVar61 < auVar88._4_4_);
        iVar86 = auVar84._8_4_;
        iVar105 = -(uint)(iVar86 < auVar88._8_4_);
        iVar87 = auVar84._12_4_;
        auVar90._12_4_ = -(uint)(iVar87 < auVar88._12_4_);
        auVar18._4_4_ = iVar101;
        auVar18._0_4_ = iVar101;
        auVar18._8_4_ = iVar105;
        auVar18._12_4_ = iVar105;
        auVar49 = pshuflw(auVar49,auVar18,0xe8);
        auVar89._4_4_ = -(uint)(auVar88._4_4_ == iVar61);
        auVar89._12_4_ = -(uint)(auVar88._12_4_ == iVar87);
        auVar89._0_4_ = auVar89._4_4_;
        auVar89._8_4_ = auVar89._12_4_;
        auVar88 = pshuflw(in_XMM11,auVar89,0xe8);
        auVar90._0_4_ = auVar90._4_4_;
        auVar90._8_4_ = auVar90._12_4_;
        auVar84 = pshuflw(auVar49,auVar90,0xe8);
        auVar50._8_4_ = 0xffffffff;
        auVar50._0_8_ = 0xffffffffffffffff;
        auVar50._12_4_ = 0xffffffff;
        auVar50 = (auVar84 | auVar88 & auVar49) ^ auVar50;
        auVar49 = packssdw(auVar50,auVar50);
        if ((auVar49 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          *pIVar38 = lVar41 + -0xf < lVar39;
        }
        auVar19._4_4_ = iVar101;
        auVar19._0_4_ = iVar101;
        auVar19._8_4_ = iVar105;
        auVar19._12_4_ = iVar105;
        auVar90 = auVar89 & auVar19 | auVar90;
        auVar49 = packssdw(auVar90,auVar90);
        auVar8._8_4_ = 0xffffffff;
        auVar8._0_8_ = 0xffffffffffffffff;
        auVar8._12_4_ = 0xffffffff;
        auVar49 = packssdw(auVar49 ^ auVar8,auVar49 ^ auVar8);
        auVar49 = packsswb(auVar49,auVar49);
        if ((auVar49._0_4_ >> 8 & 1) != 0) {
          *(bool *)((long)pIVar38 + 0x68) = lVar41 + -0xe < lVar39;
        }
        auVar49 = auVar74 ^ auVar64;
        auVar76._0_4_ = -(uint)(iVar59 < auVar49._0_4_);
        auVar76._4_4_ = -(uint)(iVar61 < auVar49._4_4_);
        auVar76._8_4_ = -(uint)(iVar86 < auVar49._8_4_);
        auVar76._12_4_ = -(uint)(iVar87 < auVar49._12_4_);
        auVar91._4_4_ = auVar76._0_4_;
        auVar91._0_4_ = auVar76._0_4_;
        auVar91._8_4_ = auVar76._8_4_;
        auVar91._12_4_ = auVar76._8_4_;
        iVar101 = -(uint)(auVar49._4_4_ == iVar61);
        iVar105 = -(uint)(auVar49._12_4_ == iVar87);
        auVar20._4_4_ = iVar101;
        auVar20._0_4_ = iVar101;
        auVar20._8_4_ = iVar105;
        auVar20._12_4_ = iVar105;
        auVar102._4_4_ = auVar76._4_4_;
        auVar102._0_4_ = auVar76._4_4_;
        auVar102._8_4_ = auVar76._12_4_;
        auVar102._12_4_ = auVar76._12_4_;
        auVar49 = auVar20 & auVar91 | auVar102;
        auVar49 = packssdw(auVar49,auVar49);
        auVar9._8_4_ = 0xffffffff;
        auVar9._0_8_ = 0xffffffffffffffff;
        auVar9._12_4_ = 0xffffffff;
        auVar49 = packssdw(auVar49 ^ auVar9,auVar49 ^ auVar9);
        auVar49 = packsswb(auVar49,auVar49);
        if ((auVar49._0_4_ >> 0x10 & 1) != 0) {
          *(bool *)((long)pIVar38 + 0xd0) = lVar41 + -0xd < lVar39;
        }
        auVar49 = pshufhw(auVar49,auVar91,0x84);
        auVar21._4_4_ = iVar101;
        auVar21._0_4_ = iVar101;
        auVar21._8_4_ = iVar105;
        auVar21._12_4_ = iVar105;
        auVar88 = pshufhw(auVar76,auVar21,0x84);
        auVar84 = pshufhw(auVar49,auVar102,0x84);
        auVar51._8_4_ = 0xffffffff;
        auVar51._0_8_ = 0xffffffffffffffff;
        auVar51._12_4_ = 0xffffffff;
        auVar51 = (auVar84 | auVar88 & auVar49) ^ auVar51;
        auVar49 = packssdw(auVar51,auVar51);
        auVar49 = packsswb(auVar49,auVar49);
        if ((auVar49._0_4_ >> 0x18 & 1) != 0) {
          *(bool *)((long)pIVar38 + 0x138) = lVar41 + -0xc < lVar39;
        }
        auVar49 = auVar73 ^ auVar64;
        auVar77._0_4_ = -(uint)(iVar59 < auVar49._0_4_);
        auVar77._4_4_ = -(uint)(iVar61 < auVar49._4_4_);
        auVar77._8_4_ = -(uint)(iVar86 < auVar49._8_4_);
        auVar77._12_4_ = -(uint)(iVar87 < auVar49._12_4_);
        auVar22._4_4_ = auVar77._0_4_;
        auVar22._0_4_ = auVar77._0_4_;
        auVar22._8_4_ = auVar77._8_4_;
        auVar22._12_4_ = auVar77._8_4_;
        auVar88 = pshuflw(auVar102,auVar22,0xe8);
        auVar52._0_4_ = -(uint)(auVar49._0_4_ == iVar59);
        auVar52._4_4_ = -(uint)(auVar49._4_4_ == iVar61);
        auVar52._8_4_ = -(uint)(auVar49._8_4_ == iVar86);
        auVar52._12_4_ = -(uint)(auVar49._12_4_ == iVar87);
        auVar92._4_4_ = auVar52._4_4_;
        auVar92._0_4_ = auVar52._4_4_;
        auVar92._8_4_ = auVar52._12_4_;
        auVar92._12_4_ = auVar52._12_4_;
        auVar49 = pshuflw(auVar52,auVar92,0xe8);
        auVar93._4_4_ = auVar77._4_4_;
        auVar93._0_4_ = auVar77._4_4_;
        auVar93._8_4_ = auVar77._12_4_;
        auVar93._12_4_ = auVar77._12_4_;
        auVar84 = pshuflw(auVar77,auVar93,0xe8);
        auVar10._8_4_ = 0xffffffff;
        auVar10._0_8_ = 0xffffffffffffffff;
        auVar10._12_4_ = 0xffffffff;
        auVar49 = packssdw(auVar49 & auVar88,(auVar84 | auVar49 & auVar88) ^ auVar10);
        auVar49 = packsswb(auVar49,auVar49);
        if ((auVar49 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
          *(bool *)((long)pIVar38 + 0x1a0) = lVar41 + -0xb < lVar39;
        }
        auVar23._4_4_ = auVar77._0_4_;
        auVar23._0_4_ = auVar77._0_4_;
        auVar23._8_4_ = auVar77._8_4_;
        auVar23._12_4_ = auVar77._8_4_;
        auVar93 = auVar92 & auVar23 | auVar93;
        auVar84 = packssdw(auVar93,auVar93);
        auVar11._8_4_ = 0xffffffff;
        auVar11._0_8_ = 0xffffffffffffffff;
        auVar11._12_4_ = 0xffffffff;
        auVar49 = packssdw(auVar49,auVar84 ^ auVar11);
        auVar49 = packsswb(auVar49,auVar49);
        if ((auVar49._4_2_ >> 8 & 1) != 0) {
          *(bool *)((long)pIVar38 + 0x208) = lVar41 + -10 < lVar39;
        }
        auVar49 = auVar72 ^ auVar64;
        auVar78._0_4_ = -(uint)(iVar59 < auVar49._0_4_);
        auVar78._4_4_ = -(uint)(iVar61 < auVar49._4_4_);
        auVar78._8_4_ = -(uint)(iVar86 < auVar49._8_4_);
        auVar78._12_4_ = -(uint)(iVar87 < auVar49._12_4_);
        auVar94._4_4_ = auVar78._0_4_;
        auVar94._0_4_ = auVar78._0_4_;
        auVar94._8_4_ = auVar78._8_4_;
        auVar94._12_4_ = auVar78._8_4_;
        iVar101 = -(uint)(auVar49._4_4_ == iVar61);
        iVar105 = -(uint)(auVar49._12_4_ == iVar87);
        auVar24._4_4_ = iVar101;
        auVar24._0_4_ = iVar101;
        auVar24._8_4_ = iVar105;
        auVar24._12_4_ = iVar105;
        auVar103._4_4_ = auVar78._4_4_;
        auVar103._0_4_ = auVar78._4_4_;
        auVar103._8_4_ = auVar78._12_4_;
        auVar103._12_4_ = auVar78._12_4_;
        auVar49 = auVar24 & auVar94 | auVar103;
        auVar49 = packssdw(auVar49,auVar49);
        auVar12._8_4_ = 0xffffffff;
        auVar12._0_8_ = 0xffffffffffffffff;
        auVar12._12_4_ = 0xffffffff;
        auVar49 = packssdw(auVar49 ^ auVar12,auVar49 ^ auVar12);
        auVar49 = packsswb(auVar49,auVar49);
        if ((auVar49 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
          *(bool *)((long)pIVar38 + 0x270) = lVar41 + -9 < lVar39;
        }
        auVar49 = pshufhw(auVar49,auVar94,0x84);
        auVar25._4_4_ = iVar101;
        auVar25._0_4_ = iVar101;
        auVar25._8_4_ = iVar105;
        auVar25._12_4_ = iVar105;
        auVar88 = pshufhw(auVar78,auVar25,0x84);
        auVar84 = pshufhw(auVar49,auVar103,0x84);
        auVar53._8_4_ = 0xffffffff;
        auVar53._0_8_ = 0xffffffffffffffff;
        auVar53._12_4_ = 0xffffffff;
        auVar53 = (auVar84 | auVar88 & auVar49) ^ auVar53;
        auVar49 = packssdw(auVar53,auVar53);
        auVar49 = packsswb(auVar49,auVar49);
        if ((auVar49._6_2_ >> 8 & 1) != 0) {
          *(bool *)((long)pIVar38 + 0x2d8) = lVar41 + -8 < lVar39;
        }
        auVar49 = auVar71 ^ auVar64;
        auVar79._0_4_ = -(uint)(iVar59 < auVar49._0_4_);
        auVar79._4_4_ = -(uint)(iVar61 < auVar49._4_4_);
        auVar79._8_4_ = -(uint)(iVar86 < auVar49._8_4_);
        auVar79._12_4_ = -(uint)(iVar87 < auVar49._12_4_);
        auVar26._4_4_ = auVar79._0_4_;
        auVar26._0_4_ = auVar79._0_4_;
        auVar26._8_4_ = auVar79._8_4_;
        auVar26._12_4_ = auVar79._8_4_;
        auVar88 = pshuflw(auVar103,auVar26,0xe8);
        auVar54._0_4_ = -(uint)(auVar49._0_4_ == iVar59);
        auVar54._4_4_ = -(uint)(auVar49._4_4_ == iVar61);
        auVar54._8_4_ = -(uint)(auVar49._8_4_ == iVar86);
        auVar54._12_4_ = -(uint)(auVar49._12_4_ == iVar87);
        auVar95._4_4_ = auVar54._4_4_;
        auVar95._0_4_ = auVar54._4_4_;
        auVar95._8_4_ = auVar54._12_4_;
        auVar95._12_4_ = auVar54._12_4_;
        auVar49 = pshuflw(auVar54,auVar95,0xe8);
        auVar96._4_4_ = auVar79._4_4_;
        auVar96._0_4_ = auVar79._4_4_;
        auVar96._8_4_ = auVar79._12_4_;
        auVar96._12_4_ = auVar79._12_4_;
        auVar84 = pshuflw(auVar79,auVar96,0xe8);
        auVar80._8_4_ = 0xffffffff;
        auVar80._0_8_ = 0xffffffffffffffff;
        auVar80._12_4_ = 0xffffffff;
        auVar80 = (auVar84 | auVar49 & auVar88) ^ auVar80;
        auVar84 = packssdw(auVar80,auVar80);
        auVar49 = packsswb(auVar49 & auVar88,auVar84);
        if ((auVar49 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          *(bool *)((long)pIVar38 + 0x340) = lVar41 + -7 < lVar39;
        }
        auVar27._4_4_ = auVar79._0_4_;
        auVar27._0_4_ = auVar79._0_4_;
        auVar27._8_4_ = auVar79._8_4_;
        auVar27._12_4_ = auVar79._8_4_;
        auVar96 = auVar95 & auVar27 | auVar96;
        auVar84 = packssdw(auVar96,auVar96);
        auVar13._8_4_ = 0xffffffff;
        auVar13._0_8_ = 0xffffffffffffffff;
        auVar13._12_4_ = 0xffffffff;
        auVar84 = packssdw(auVar84 ^ auVar13,auVar84 ^ auVar13);
        auVar49 = packsswb(auVar49,auVar84);
        if ((auVar49._8_2_ >> 8 & 1) != 0) {
          *(bool *)((long)pIVar38 + 0x3a8) = lVar41 + -6 < lVar39;
        }
        auVar49 = auVar70 ^ auVar64;
        auVar81._0_4_ = -(uint)(iVar59 < auVar49._0_4_);
        auVar81._4_4_ = -(uint)(iVar61 < auVar49._4_4_);
        auVar81._8_4_ = -(uint)(iVar86 < auVar49._8_4_);
        auVar81._12_4_ = -(uint)(iVar87 < auVar49._12_4_);
        auVar97._4_4_ = auVar81._0_4_;
        auVar97._0_4_ = auVar81._0_4_;
        auVar97._8_4_ = auVar81._8_4_;
        auVar97._12_4_ = auVar81._8_4_;
        iVar101 = -(uint)(auVar49._4_4_ == iVar61);
        iVar105 = -(uint)(auVar49._12_4_ == iVar87);
        auVar28._4_4_ = iVar101;
        auVar28._0_4_ = iVar101;
        auVar28._8_4_ = iVar105;
        auVar28._12_4_ = iVar105;
        auVar104._4_4_ = auVar81._4_4_;
        auVar104._0_4_ = auVar81._4_4_;
        auVar104._8_4_ = auVar81._12_4_;
        auVar104._12_4_ = auVar81._12_4_;
        auVar49 = auVar28 & auVar97 | auVar104;
        auVar49 = packssdw(auVar49,auVar49);
        auVar14._8_4_ = 0xffffffff;
        auVar14._0_8_ = 0xffffffffffffffff;
        auVar14._12_4_ = 0xffffffff;
        auVar49 = packssdw(auVar49 ^ auVar14,auVar49 ^ auVar14);
        auVar49 = packsswb(auVar49,auVar49);
        if ((auVar49 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
          *(bool *)((long)pIVar38 + 0x410) = lVar41 + -5 < lVar39;
        }
        auVar49 = pshufhw(auVar49,auVar97,0x84);
        auVar29._4_4_ = iVar101;
        auVar29._0_4_ = iVar101;
        auVar29._8_4_ = iVar105;
        auVar29._12_4_ = iVar105;
        auVar88 = pshufhw(auVar81,auVar29,0x84);
        auVar84 = pshufhw(auVar49,auVar104,0x84);
        auVar55._8_4_ = 0xffffffff;
        auVar55._0_8_ = 0xffffffffffffffff;
        auVar55._12_4_ = 0xffffffff;
        auVar55 = (auVar84 | auVar88 & auVar49) ^ auVar55;
        auVar49 = packssdw(auVar55,auVar55);
        auVar49 = packsswb(auVar49,auVar49);
        if ((auVar49._10_2_ >> 8 & 1) != 0) {
          *(bool *)((long)pIVar38 + 0x478) = lVar41 + -4 < lVar39;
        }
        auVar49 = auVar69 ^ auVar64;
        auVar82._0_4_ = -(uint)(iVar59 < auVar49._0_4_);
        auVar82._4_4_ = -(uint)(iVar61 < auVar49._4_4_);
        auVar82._8_4_ = -(uint)(iVar86 < auVar49._8_4_);
        auVar82._12_4_ = -(uint)(iVar87 < auVar49._12_4_);
        auVar30._4_4_ = auVar82._0_4_;
        auVar30._0_4_ = auVar82._0_4_;
        auVar30._8_4_ = auVar82._8_4_;
        auVar30._12_4_ = auVar82._8_4_;
        auVar88 = pshuflw(auVar104,auVar30,0xe8);
        auVar56._0_4_ = -(uint)(auVar49._0_4_ == iVar59);
        auVar56._4_4_ = -(uint)(auVar49._4_4_ == iVar61);
        auVar56._8_4_ = -(uint)(auVar49._8_4_ == iVar86);
        auVar56._12_4_ = -(uint)(auVar49._12_4_ == iVar87);
        auVar98._4_4_ = auVar56._4_4_;
        auVar98._0_4_ = auVar56._4_4_;
        auVar98._8_4_ = auVar56._12_4_;
        auVar98._12_4_ = auVar56._12_4_;
        auVar49 = pshuflw(auVar56,auVar98,0xe8);
        auVar99._4_4_ = auVar82._4_4_;
        auVar99._0_4_ = auVar82._4_4_;
        auVar99._8_4_ = auVar82._12_4_;
        auVar99._12_4_ = auVar82._12_4_;
        auVar84 = pshuflw(auVar82,auVar99,0xe8);
        auVar15._8_4_ = 0xffffffff;
        auVar15._0_8_ = 0xffffffffffffffff;
        auVar15._12_4_ = 0xffffffff;
        auVar49 = packssdw(auVar49 & auVar88,(auVar84 | auVar49 & auVar88) ^ auVar15);
        auVar49 = packsswb(auVar49,auVar49);
        if ((auVar49 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
          *(bool *)((long)pIVar38 + 0x4e0) = lVar41 + -3 < lVar39;
        }
        auVar31._4_4_ = auVar82._0_4_;
        auVar31._0_4_ = auVar82._0_4_;
        auVar31._8_4_ = auVar82._8_4_;
        auVar31._12_4_ = auVar82._8_4_;
        auVar99 = auVar98 & auVar31 | auVar99;
        auVar84 = packssdw(auVar99,auVar99);
        auVar16._8_4_ = 0xffffffff;
        auVar16._0_8_ = 0xffffffffffffffff;
        auVar16._12_4_ = 0xffffffff;
        auVar49 = packssdw(auVar49,auVar84 ^ auVar16);
        auVar49 = packsswb(auVar49,auVar49);
        if ((auVar49._12_2_ >> 8 & 1) != 0) {
          *(bool *)((long)pIVar38 + 0x548) = lVar41 + -2 < lVar39;
        }
        auVar49 = auVar66 ^ auVar64;
        auVar83._0_4_ = -(uint)(iVar59 < auVar49._0_4_);
        auVar83._4_4_ = -(uint)(iVar61 < auVar49._4_4_);
        auVar83._8_4_ = -(uint)(iVar86 < auVar49._8_4_);
        auVar83._12_4_ = -(uint)(iVar87 < auVar49._12_4_);
        auVar100._4_4_ = auVar83._0_4_;
        auVar100._0_4_ = auVar83._0_4_;
        auVar100._8_4_ = auVar83._8_4_;
        auVar100._12_4_ = auVar83._8_4_;
        iVar59 = -(uint)(auVar49._4_4_ == iVar61);
        iVar61 = -(uint)(auVar49._12_4_ == iVar87);
        auVar85._4_4_ = iVar59;
        auVar85._0_4_ = iVar59;
        auVar85._8_4_ = iVar61;
        auVar85._12_4_ = iVar61;
        auVar57._4_4_ = auVar83._4_4_;
        auVar57._0_4_ = auVar83._4_4_;
        auVar57._8_4_ = auVar83._12_4_;
        auVar57._12_4_ = auVar83._12_4_;
        auVar57 = auVar85 & auVar100 | auVar57;
        auVar49 = packssdw(auVar57,auVar57);
        auVar17._8_4_ = 0xffffffff;
        auVar17._0_8_ = 0xffffffffffffffff;
        auVar17._12_4_ = 0xffffffff;
        auVar49 = packssdw(auVar49 ^ auVar17,auVar49 ^ auVar17);
        auVar49 = packsswb(auVar49,auVar49);
        if ((auVar49 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
          *(bool *)((long)pIVar38 + 0x5b0) = lVar41 + -1 < lVar39;
        }
        auVar49 = pshufhw(auVar49,auVar100,0x84);
        auVar84 = pshufhw(auVar83,auVar85,0x84);
        in_XMM11 = auVar84 & auVar49;
        auVar32._4_4_ = auVar83._4_4_;
        auVar32._0_4_ = auVar83._4_4_;
        auVar32._8_4_ = auVar83._12_4_;
        auVar32._12_4_ = auVar83._12_4_;
        auVar49 = pshufhw(auVar49,auVar32,0x84);
        auVar58._8_4_ = 0xffffffff;
        auVar58._0_8_ = 0xffffffffffffffff;
        auVar58._12_4_ = 0xffffffff;
        auVar58 = (auVar49 | in_XMM11) ^ auVar58;
        auVar49 = packssdw(auVar58,auVar58);
        auVar49 = packsswb(auVar49,auVar49);
        if ((auVar49._14_2_ >> 8 & 1) != 0) {
          *(bool *)((long)pIVar38 + 0x618) = lVar41 < lVar39;
        }
        lVar48 = (long)DAT_00170670;
        lVar67 = auVar75._8_8_;
        auVar75._0_8_ = auVar75._0_8_ + lVar48;
        lVar60 = DAT_00170670._8_8_;
        auVar75._8_8_ = lVar67 + lVar60;
        lVar67 = auVar74._8_8_;
        auVar74._0_8_ = auVar74._0_8_ + lVar48;
        auVar74._8_8_ = lVar67 + lVar60;
        lVar67 = auVar73._8_8_;
        auVar73._0_8_ = auVar73._0_8_ + lVar48;
        auVar73._8_8_ = lVar67 + lVar60;
        lVar67 = auVar72._8_8_;
        auVar72._0_8_ = auVar72._0_8_ + lVar48;
        auVar72._8_8_ = lVar67 + lVar60;
        lVar67 = auVar71._8_8_;
        auVar71._0_8_ = auVar71._0_8_ + lVar48;
        auVar71._8_8_ = lVar67 + lVar60;
        lVar67 = auVar70._8_8_;
        auVar70._0_8_ = auVar70._0_8_ + lVar48;
        auVar70._8_8_ = lVar67 + lVar60;
        lVar67 = auVar69._8_8_;
        auVar69._0_8_ = auVar69._0_8_ + lVar48;
        auVar69._8_8_ = lVar67 + lVar60;
        lVar67 = auVar66._8_8_;
        auVar66._0_8_ = auVar66._0_8_ + lVar48;
        auVar66._8_8_ = lVar67 + lVar60;
        pIVar38 = pIVar38 + 0x680;
        lVar48 = lVar41 - (ulong)(iVar44 + 0xfU & 0xfffffff0);
        lVar41 = lVar41 + 0x10;
        auVar49 = _DAT_00170670;
      } while (lVar48 != -1);
    }
  }
  if (iVar40 == iVar42) {
    table->IsUnfrozenRows = true;
    fVar47 = table->RowPosY2;
    fVar62 = (pIVar5->InnerClipRect).Min.y;
    fVar68 = (pIVar5->InnerClipRect).Max.y;
    uVar45 = -(uint)(fVar62 <= fVar47 + 1.0);
    fVar62 = (float)(~uVar45 & (uint)fVar62 | (uint)(fVar47 + 1.0) & uVar45);
    if (fVar68 <= fVar62) {
      fVar62 = fVar68;
    }
    (table->Bg2ClipRectForDrawCmd).Min.y = fVar62;
    (table->BgClipRect).Min.y = fVar62;
    (table->Bg2ClipRectForDrawCmd).Max.y = fVar68;
    (table->BgClipRect).Max.y = fVar68;
    table->Bg2DrawChannelCurrent = table->Bg2DrawChannelUnfrozen;
    fVar68 = table->RowPosY1;
    fVar63 = (fVar47 + (table->WorkRect).Min.y) - (table->OuterRect).Min.y;
    (pIVar5->DC).CursorPos.y = fVar63;
    table->RowPosY2 = fVar63;
    table->RowPosY1 = fVar63 - (fVar47 - fVar68);
    iVar44 = table->ColumnsCount;
    if (0 < (long)iVar44) {
      pIVar7 = (table->Columns).Data;
      lVar39 = 0;
      do {
        (&pIVar7->DrawChannelCurrent)[lVar39] = (&pIVar7->DrawChannelUnfrozen)[lVar39];
        *(float *)((long)&(pIVar7->ClipRect).Min.y + lVar39) = fVar62;
        lVar39 = lVar39 + 0x68;
      } while ((long)iVar44 * 0x68 - lVar39 != 0);
    }
    pIVar7 = (table->Columns).Data;
    IVar3 = (pIVar7->ClipRect).Max;
    IVar34 = (pIVar7->ClipRect).Min;
    IVar35 = (pIVar7->ClipRect).Max;
    (pIVar5->ClipRect).Min = (pIVar7->ClipRect).Min;
    (pIVar5->ClipRect).Max = IVar3;
    pIVar6 = pIVar5->DrawList;
    (pIVar6->_CmdHeader).ClipRect.x = IVar34.x;
    (pIVar6->_CmdHeader).ClipRect.y = IVar34.y;
    (pIVar6->_CmdHeader).ClipRect.z = IVar35.x;
    (pIVar6->_CmdHeader).ClipRect.w = IVar35.y;
    pIVar2 = (pIVar5->DrawList->_ClipRectStack).Data +
             (long)(pIVar5->DrawList->_ClipRectStack).Size + -1;
    pIVar2->x = IVar34.x;
    pIVar2->y = IVar34.y;
    pIVar2->z = IVar35.x;
    pIVar2->w = IVar35.y;
    ImDrawListSplitter::SetCurrentChannel
              (&table->DrawSplitter,pIVar5->DrawList,
               (uint)((table->Columns).Data)->DrawChannelCurrent);
  }
  if ((table->field_0x90 & 1) == 0) {
    table->RowBgColorCounter = table->RowBgColorCounter + 1;
  }
  table->IsInsideRow = false;
  return;
}

Assistant:

void ImGui::TableEndRow(ImGuiTable* table)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    IM_ASSERT(window == table->InnerWindow);
    IM_ASSERT(table->IsInsideRow);

    if (table->CurrentColumn != -1)
        TableEndCell(table);

    // Logging
    if (g.LogEnabled)
        LogRenderedText(NULL, "|");

    // Position cursor at the bottom of our row so it can be used for e.g. clipping calculation. However it is
    // likely that the next call to TableBeginCell() will reposition the cursor to take account of vertical padding.
    window->DC.CursorPos.y = table->RowPosY2;

    // Row background fill
    const float bg_y1 = table->RowPosY1;
    const float bg_y2 = table->RowPosY2;
    const bool unfreeze_rows_actual = (table->CurrentRow + 1 == table->FreezeRowsCount);
    const bool unfreeze_rows_request = (table->CurrentRow + 1 == table->FreezeRowsRequest);
    if (table->CurrentRow == 0)
        table->LastFirstRowHeight = bg_y2 - bg_y1;

    const bool is_visible = (bg_y2 >= table->InnerClipRect.Min.y && bg_y1 <= table->InnerClipRect.Max.y);
    if (is_visible)
    {
        // Decide of background color for the row
        ImU32 bg_col0 = 0;
        ImU32 bg_col1 = 0;
        if (table->RowBgColor[0] != IM_COL32_DISABLE)
            bg_col0 = table->RowBgColor[0];
        else if (table->Flags & ImGuiTableFlags_RowBg)
            bg_col0 = GetColorU32((table->RowBgColorCounter & 1) ? ImGuiCol_TableRowBgAlt : ImGuiCol_TableRowBg);
        if (table->RowBgColor[1] != IM_COL32_DISABLE)
            bg_col1 = table->RowBgColor[1];

        // Decide of top border color
        ImU32 border_col = 0;
        const float border_size = TABLE_BORDER_SIZE;
        if (table->CurrentRow > 0 || table->InnerWindow == table->OuterWindow)
            if (table->Flags & ImGuiTableFlags_BordersInnerH)
                border_col = (table->LastRowFlags & ImGuiTableRowFlags_Headers) ? table->BorderColorStrong : table->BorderColorLight;

        const bool draw_cell_bg_color = table->RowCellDataCurrent >= 0;
        const bool draw_strong_bottom_border = unfreeze_rows_actual;
        if ((bg_col0 | bg_col1 | border_col) != 0 || draw_strong_bottom_border || draw_cell_bg_color)
        {
            // In theory we could call SetWindowClipRectBeforeSetChannel() but since we know TableEndRow() is
            // always followed by a change of clipping rectangle we perform the smallest overwrite possible here.
            if ((table->Flags & ImGuiTableFlags_NoClip) == 0)
                window->DrawList->_CmdHeader.ClipRect = table->Bg0ClipRectForDrawCmd.ToVec4();
            table->DrawSplitter.SetCurrentChannel(window->DrawList, TABLE_DRAW_CHANNEL_BG0);
        }

        // Draw row background
        // We soft/cpu clip this so all backgrounds and borders can share the same clipping rectangle
        if (bg_col0 || bg_col1)
        {
            ImRect row_rect(table->WorkRect.Min.x, bg_y1, table->WorkRect.Max.x, bg_y2);
            row_rect.ClipWith(table->BgClipRect);
            if (bg_col0 != 0 && row_rect.Min.y < row_rect.Max.y)
                window->DrawList->AddRectFilled(row_rect.Min, row_rect.Max, bg_col0);
            if (bg_col1 != 0 && row_rect.Min.y < row_rect.Max.y)
                window->DrawList->AddRectFilled(row_rect.Min, row_rect.Max, bg_col1);
        }

        // Draw cell background color
        if (draw_cell_bg_color)
        {
            ImGuiTableCellData* cell_data_end = &table->RowCellData[table->RowCellDataCurrent];
            for (ImGuiTableCellData* cell_data = &table->RowCellData[0]; cell_data <= cell_data_end; cell_data++)
            {
                const ImGuiTableColumn* column = &table->Columns[cell_data->Column];
                ImRect cell_bg_rect = TableGetCellBgRect(table, cell_data->Column);
                cell_bg_rect.ClipWith(table->BgClipRect);
                cell_bg_rect.Min.x = ImMax(cell_bg_rect.Min.x, column->ClipRect.Min.x);     // So that first column after frozen one gets clipped
                cell_bg_rect.Max.x = ImMin(cell_bg_rect.Max.x, column->MaxX);
                window->DrawList->AddRectFilled(cell_bg_rect.Min, cell_bg_rect.Max, cell_data->BgColor);
            }
        }

        // Draw top border
        if (border_col && bg_y1 >= table->BgClipRect.Min.y && bg_y1 < table->BgClipRect.Max.y)
            window->DrawList->AddLine(ImVec2(table->BorderX1, bg_y1), ImVec2(table->BorderX2, bg_y1), border_col, border_size);

        // Draw bottom border at the row unfreezing mark (always strong)
        if (draw_strong_bottom_border && bg_y2 >= table->BgClipRect.Min.y && bg_y2 < table->BgClipRect.Max.y)
            window->DrawList->AddLine(ImVec2(table->BorderX1, bg_y2), ImVec2(table->BorderX2, bg_y2), table->BorderColorStrong, border_size);
    }

    // End frozen rows (when we are past the last frozen row line, teleport cursor and alter clipping rectangle)
    // We need to do that in TableEndRow() instead of TableBeginRow() so the list clipper can mark end of row and
    // get the new cursor position.
    if (unfreeze_rows_request)
        for (int column_n = 0; column_n < table->ColumnsCount; column_n++)
        {
            ImGuiTableColumn* column = &table->Columns[column_n];
            column->NavLayerCurrent = (ImS8)((column_n < table->FreezeColumnsCount) ? ImGuiNavLayer_Menu : ImGuiNavLayer_Main);
        }
    if (unfreeze_rows_actual)
    {
        IM_ASSERT(table->IsUnfrozenRows == false);
        table->IsUnfrozenRows = true;

        // BgClipRect starts as table->InnerClipRect, reduce it now and make BgClipRectForDrawCmd == BgClipRect
        float y0 = ImMax(table->RowPosY2 + 1, window->InnerClipRect.Min.y);
        table->BgClipRect.Min.y = table->Bg2ClipRectForDrawCmd.Min.y = ImMin(y0, window->InnerClipRect.Max.y);
        table->BgClipRect.Max.y = table->Bg2ClipRectForDrawCmd.Max.y = window->InnerClipRect.Max.y;
        table->Bg2DrawChannelCurrent = table->Bg2DrawChannelUnfrozen;
        IM_ASSERT(table->Bg2ClipRectForDrawCmd.Min.y <= table->Bg2ClipRectForDrawCmd.Max.y);

        float row_height = table->RowPosY2 - table->RowPosY1;
        table->RowPosY2 = window->DC.CursorPos.y = table->WorkRect.Min.y + table->RowPosY2 - table->OuterRect.Min.y;
        table->RowPosY1 = table->RowPosY2 - row_height;
        for (int column_n = 0; column_n < table->ColumnsCount; column_n++)
        {
            ImGuiTableColumn* column = &table->Columns[column_n];
            column->DrawChannelCurrent = column->DrawChannelUnfrozen;
            column->ClipRect.Min.y = table->Bg2ClipRectForDrawCmd.Min.y;
        }

        // Update cliprect ahead of TableBeginCell() so clipper can access to new ClipRect->Min.y
        SetWindowClipRectBeforeSetChannel(window, table->Columns[0].ClipRect);
        table->DrawSplitter.SetCurrentChannel(window->DrawList, table->Columns[0].DrawChannelCurrent);
    }

    if (!(table->RowFlags & ImGuiTableRowFlags_Headers))
        table->RowBgColorCounter++;
    table->IsInsideRow = false;
}